

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::StyledWriter(StyledWriter *this)

{
  Writer *in_RDI;
  
  Writer::Writer(in_RDI);
  in_RDI->_vptr_Writer = (_func_int **)&PTR__StyledWriter_00148d30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12c474);
  std::__cxx11::string::string((string *)(in_RDI + 4));
  std::__cxx11::string::string((string *)(in_RDI + 8));
  *(undefined4 *)&in_RDI[0xc]._vptr_Writer = 0x4a;
  *(undefined4 *)((long)&in_RDI[0xc]._vptr_Writer + 4) = 3;
  *(undefined1 *)&in_RDI[0xd]._vptr_Writer = 0;
  return;
}

Assistant:

StyledWriter::StyledWriter()
    : rightMargin_(74), indentSize_(3), addChildValues_() {}